

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-coroutine-test.c++
# Opt level: O2

Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> __thiscall
kj::anon_unknown_0::httpClientConnect(anon_unknown_0 *this,AsyncIoContext *io)

{
  Coroutine<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *this_00;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *pOVar1;
  PromiseAwaiter<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *__return_storage_ptr__;
  PromiseAwaiter<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *__return_storage_ptr___00;
  SourceLocation location;
  bool bVar2;
  int iVar3;
  coroutine_handle<void> handle;
  undefined4 extraout_var;
  PromiseAwaiter<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *this_01;
  
  handle._M_fr_ptr = operator_new(0x5f8);
  *(code **)handle._M_fr_ptr = httpClientConnect;
  *(code **)((long)handle._M_fr_ptr + 8) = httpClientConnect;
  this_00 = (Coroutine<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)
            ((long)handle._M_fr_ptr + 0x10);
  location.function = "httpClientConnect";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-coroutine-test.c++"
  ;
  location.lineNumber = 0x1d5;
  location.columnNumber = 0x1d;
  kj::_::Coroutine<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::Coroutine(this_00,handle,location);
  kj::_::Coroutine<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::get_return_object
            ((Coroutine<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)this);
  iVar3 = (*((io->provider).ptr)->_vptr_AsyncIoProvider[3])();
  pOVar1 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0x5e0);
  (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar3))
            (pOVar1,(undefined8 *)CONCAT44(extraout_var,iVar3),"capnproto.org",0xe,0x50);
  __return_storage_ptr__ =
       (PromiseAwaiter<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *)
       ((long)handle._M_fr_ptr + 0x240);
  co_await<kj::Own<kj::NetworkAddress,decltype(nullptr)>>
            (__return_storage_ptr__,(Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *)pOVar1)
  ;
  *(undefined1 *)((long)handle._M_fr_ptr + 0x5f0) = 0;
  bVar2 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                    ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
  if (!bVar2) {
    kj::_::PromiseAwaiter<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>::await_resume
              ((PromiseAwaiter<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *)
               ((long)handle._M_fr_ptr + 0x5c0));
    kj::_::PromiseAwaiter<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>::~PromiseAwaiter
              (__return_storage_ptr__);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(pOVar1);
    pOVar1 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0x5e8);
    (**(code **)**(undefined8 **)((long)handle._M_fr_ptr + 0x5c8))(pOVar1);
    __return_storage_ptr___00 =
         (PromiseAwaiter<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)
         ((long)handle._M_fr_ptr + 0x400);
    co_await<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>
              (__return_storage_ptr___00,
               (Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)pOVar1);
    *(undefined1 *)((long)handle._M_fr_ptr + 0x5f0) = 1;
    bVar2 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)__return_storage_ptr___00,(CoroutineBase *)this_00);
    if (!bVar2) {
      this_01 = (PromiseAwaiter<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)
                ((long)handle._M_fr_ptr + 0x5d0);
      kj::_::PromiseAwaiter<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::await_resume(this_01);
      kj::_::Coroutine<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::fulfill
                (this_00,(FixVoid<kj::Own<kj::AsyncIoStream>_> *)this_01);
      Own<kj::AsyncIoStream,_std::nullptr_t>::dispose
                ((Own<kj::AsyncIoStream,_std::nullptr_t> *)this_01);
      kj::_::PromiseAwaiter<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::~PromiseAwaiter
                (__return_storage_ptr___00);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(pOVar1);
      Own<kj::NetworkAddress,_std::nullptr_t>::dispose
                ((Own<kj::NetworkAddress,_std::nullptr_t> *)((long)handle._M_fr_ptr + 0x5c0));
      *(undefined8 *)handle._M_fr_ptr = 0;
      *(undefined1 *)((long)handle._M_fr_ptr + 0x5f0) = 2;
    }
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<Own<AsyncIoStream>> httpClientConnect(AsyncIoContext& io) {
  auto addr = co_await io.provider->getNetwork().parseAddress("capnproto.org", 80);
  co_return co_await addr->connect();
}